

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O1

void __thiscall
SessionObject::SessionObject
          (SessionObject *this,SessionObjectStore *inParent,CK_SLOT_ID inSlotID,
          CK_SESSION_HANDLE inHSession,bool inIsPrivate)

{
  _Rb_tree_header *p_Var1;
  MutexFactory *this_00;
  Mutex *pMVar2;
  
  (this->super_OSObject)._vptr_OSObject = (_func_int **)&PTR__SessionObject_0019fbf8;
  p_Var1 = &(this->attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->hSession = inHSession;
  this->slotID = inSlotID;
  this->isPrivate = inIsPrivate;
  this_00 = MutexFactory::i();
  pMVar2 = MutexFactory::getMutex(this_00);
  this->objectMutex = pMVar2;
  this->valid = pMVar2 != (Mutex *)0x0;
  this->parent = inParent;
  return;
}

Assistant:

SessionObject::SessionObject(SessionObjectStore* inParent, CK_SLOT_ID inSlotID, CK_SESSION_HANDLE inHSession, bool inIsPrivate)
{
	hSession = inHSession;
	slotID = inSlotID;
	isPrivate = inIsPrivate;
	objectMutex = MutexFactory::i()->getMutex();
	valid = (objectMutex != NULL);
	parent = inParent;
}